

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O1

exr_result_t
exr_decoding_update(exr_const_context_t ctxt,int part_index,exr_chunk_info_t *cinfo,
                   exr_decode_pipeline_t *decode)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  exr_result_t eVar14;
  
  if (ctxt == (exr_const_context_t)0x0) {
    eVar14 = 2;
  }
  else {
    eVar14 = 4;
    if ((-1 < part_index) && (part_index < ctxt->num_parts)) {
      if (cinfo == (exr_chunk_info_t *)0x0 || decode == (exr_decode_pipeline_t *)0x0) {
        eVar14 = (*ctxt->standard_error)(ctxt,3);
        return eVar14;
      }
      if ((decode->context != ctxt) || (decode->part_index != part_index)) {
        eVar14 = (*ctxt->report_error)
                           (ctxt,3,
                            "Invalid request for decoding update from different context / part");
        return eVar14;
      }
      eVar14 = internal_coding_update_channel_info
                         (decode->channels,decode->channel_count,cinfo,ctxt,
                          ctxt->parts[(uint)part_index]);
      iVar6 = cinfo->start_x;
      iVar7 = cinfo->start_y;
      iVar8 = cinfo->height;
      iVar9 = cinfo->width;
      uVar10 = cinfo->level_x;
      uVar11 = cinfo->level_y;
      uVar12 = cinfo->type;
      uVar13 = cinfo->compression;
      uVar1 = cinfo->data_offset;
      uVar2 = cinfo->packed_size;
      uVar3 = cinfo->unpacked_size;
      uVar4 = cinfo->sample_count_data_offset;
      uVar5 = cinfo->sample_count_table_size;
      (decode->chunk).idx = cinfo->idx;
      (decode->chunk).start_x = iVar6;
      (decode->chunk).start_y = iVar7;
      (decode->chunk).height = iVar8;
      (decode->chunk).width = iVar9;
      (decode->chunk).level_x = uVar10;
      (decode->chunk).level_y = uVar11;
      (decode->chunk).type = uVar12;
      (decode->chunk).compression = uVar13;
      (decode->chunk).data_offset = uVar1;
      (decode->chunk).packed_size = uVar2;
      (decode->chunk).unpacked_size = uVar3;
      (decode->chunk).sample_count_data_offset = uVar4;
      (decode->chunk).sample_count_table_size = uVar5;
    }
  }
  return eVar14;
}

Assistant:

exr_result_t
exr_decoding_update (
    exr_const_context_t     ctxt,
    int                     part_index,
    const exr_chunk_info_t* cinfo,
    exr_decode_pipeline_t*  decode)
{
    exr_result_t rv;

    exr_const_priv_part_t part;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;
    if (part_index < 0 || part_index >= ctxt->num_parts)
        return EXR_ERR_ARGUMENT_OUT_OF_RANGE;

    if (!cinfo || !decode)
        return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);

    part = ctxt->parts[part_index];

    if (decode->context != ctxt || decode->part_index != part_index)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid request for decoding update from different context / part");

    rv = internal_coding_update_channel_info (
        decode->channels, decode->channel_count, cinfo, ctxt, part);
    decode->chunk = *cinfo;

    return rv;
}